

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgridlayout.cpp
# Opt level: O2

void __thiscall
QGridLayoutPrivate::setupLayoutData(QGridLayoutPrivate *this,int hSpacing,int vSpacing)

{
  QList<QLayoutStruct> *chain;
  QList<QLayoutStruct> *chain_00;
  int iVar1;
  long lVar2;
  QLayout *this_00;
  int *piVar3;
  int *piVar4;
  QGridBox *pQVar5;
  QLayoutStruct *pQVar6;
  int iVar7;
  int iVar8;
  pointer pQVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  bool bVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  QVarLengthArray<QGridBox_*,_256LL> grid;
  QVarLengthArray<QGridLayoutSizeTriple,_256LL> sizes;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x194 & 4) != 0) {
    this_00 = *(QLayout **)&(this->super_QLayoutPrivate).field_0x8;
    this->field_0x194 = this->field_0x194 & 0xf7;
    chain = &this->rowData;
    lVar14 = 2;
    for (lVar16 = 0; lVar16 < this->rr; lVar16 = lVar16 + 1) {
      pQVar9 = QList<QLayoutStruct>::data(chain);
      piVar3 = (this->rStretch).d.ptr;
      piVar4 = (this->rMinHeights).d.ptr;
      iVar7 = piVar4[lVar16];
      *(int *)((long)pQVar9 + lVar14 * 4 + -8) = piVar3[lVar16];
      *(int *)((long)pQVar9 + lVar14 * 4 + -4) = iVar7;
      (&pQVar9->sizeHint)[lVar14] = iVar7;
      (&pQVar9->stretch)[lVar14] = 0x7ffff;
      *(undefined2 *)(&pQVar9->minimumSize + lVar14) = 0x100;
      (&pQVar9->maximumSize)[lVar14] = 0;
      iVar7 = 0x7ffff;
      if (piVar3[lVar16] == 0) {
        iVar7 = piVar4[lVar16];
      }
      pQVar9 = QList<QLayoutStruct>::data(chain);
      (&pQVar9->stretch)[lVar14] = iVar7;
      lVar14 = lVar14 + 8;
    }
    chain_00 = &this->colData;
    lVar14 = 2;
    for (lVar16 = 0; lVar16 < this->cc; lVar16 = lVar16 + 1) {
      pQVar9 = QList<QLayoutStruct>::data(chain_00);
      piVar3 = (this->cStretch).d.ptr;
      piVar4 = (this->cMinWidths).d.ptr;
      iVar7 = piVar4[lVar16];
      *(int *)((long)pQVar9 + lVar14 * 4 + -8) = piVar3[lVar16];
      *(int *)((long)pQVar9 + lVar14 * 4 + -4) = iVar7;
      (&pQVar9->sizeHint)[lVar14] = iVar7;
      (&pQVar9->stretch)[lVar14] = 0x7ffff;
      *(undefined2 *)(&pQVar9->minimumSize + lVar14) = 0x100;
      (&pQVar9->maximumSize)[lVar14] = 0;
      iVar7 = 0x7ffff;
      if (piVar3[lVar16] == 0) {
        iVar7 = piVar4[lVar16];
      }
      pQVar9 = QList<QLayoutStruct>::data(chain_00);
      (&pQVar9->stretch)[lVar14] = iVar7;
      lVar14 = lVar14 + 8;
    }
    uVar17 = (this->things).d.size;
    memset(&sizes,0xaa,0x1818);
    iVar7 = (int)uVar17;
    QVarLengthArray<QGridLayoutSizeTriple,_256LL>::QVarLengthArray(&sizes,(long)iVar7);
    memset(&grid,0xaa,0x818);
    QVarLengthArray<QGridBox_*,_256LL>::QVarLengthArray(&grid,(long)this->cc * (long)this->rr);
    uVar15 = 0;
    memset(grid.super_QVLABase<QGridBox_*>.super_QVLABaseBase.ptr,0,
           (long)this->cc * (long)this->rr * 8);
    uVar17 = uVar17 & 0xffffffff;
    if (iVar7 < 1) {
      uVar17 = uVar15;
    }
    bVar10 = false;
    for (; uVar15 != uVar17; uVar15 = uVar15 + 1) {
      pQVar5 = (this->things).d.ptr[uVar15];
      iVar7 = (*pQVar5->item_->_vptr_QLayoutItem[3])();
      lVar14 = uVar15 * 0x18;
      *(ulong *)((long)sizes.super_QVLABase<QGridLayoutSizeTriple>.super_QVLABaseBase.ptr + lVar14)
           = CONCAT44(extraout_var,iVar7);
      iVar7 = (*pQVar5->item_->_vptr_QLayoutItem[2])();
      *(ulong *)((long)sizes.super_QVLABase<QGridLayoutSizeTriple>.super_QVLABaseBase.ptr +
                lVar14 + 8) = CONCAT44(extraout_var_00,iVar7);
      iVar7 = (*pQVar5->item_->_vptr_QLayoutItem[4])();
      *(ulong *)((long)sizes.super_QVLABase<QGridLayoutSizeTriple>.super_QVLABaseBase.ptr +
                lVar14 + 0x10) = CONCAT44(extraout_var_01,iVar7);
      iVar7 = (*pQVar5->item_->_vptr_QLayoutItem[9])();
      if ((char)iVar7 != '\0') {
        this->field_0x194 = this->field_0x194 | 8;
      }
      iVar7 = this->rr + -1;
      if (-1 < pQVar5->torow) {
        iVar7 = pQVar5->torow;
      }
      if (pQVar5->row == iVar7) {
        addData(this,pQVar5,
                (QGridLayoutSizeTriple *)
                ((long)sizes.super_QVLABase<QGridLayoutSizeTriple>.super_QVLABaseBase.ptr + lVar14),
                true,false);
      }
      else {
        initEmptyMultiBox(chain,pQVar5->row,iVar7);
        bVar10 = true;
      }
      iVar7 = this->cc + -1;
      if (-1 < pQVar5->tocol) {
        iVar7 = pQVar5->tocol;
      }
      if (pQVar5->col == iVar7) {
        addData(this,pQVar5,
                (QGridLayoutSizeTriple *)
                (lVar14 + (long)sizes.super_QVLABase<QGridLayoutSizeTriple>.super_QVLABaseBase.ptr),
                false,true);
      }
      else {
        initEmptyMultiBox(chain_00,pQVar5->col,iVar7);
        bVar10 = true;
      }
      iVar7 = this->rr + -1;
      if (-1 < pQVar5->torow) {
        iVar7 = pQVar5->torow;
      }
      lVar14 = (long)pQVar5->row;
      iVar13 = this->cc;
      lVar16 = lVar14 * iVar13 * 8;
      for (; lVar14 <= iVar7; lVar14 = lVar14 + 1) {
        lVar11 = (long)pQVar5->col;
        iVar12 = pQVar5->tocol;
        if (pQVar5->tocol < 0) {
          iVar12 = iVar13 + -1;
        }
        for (; lVar11 <= iVar12; lVar11 = lVar11 + 1) {
          *(QGridBox **)
           ((long)grid.super_QVLABase<QGridBox_*>.super_QVLABaseBase.ptr + lVar11 * 8 + lVar16) =
               pQVar5;
        }
        lVar16 = lVar16 + (long)iVar13 * 8;
      }
    }
    setupSpacings(this,chain_00,(QGridBox **)grid.super_QVLABase<QGridBox_*>.super_QVLABaseBase.ptr,
                  hSpacing,Horizontal);
    setupSpacings(this,chain,(QGridBox **)grid.super_QVLABase<QGridBox_*>.super_QVLABaseBase.ptr,
                  vSpacing,Vertical);
    if (bVar10) {
      lVar14 = 1;
      for (uVar15 = 0; uVar17 != uVar15; uVar15 = uVar15 + 1) {
        pQVar5 = (this->things).d.ptr[uVar15];
        iVar7 = pQVar5->row;
        iVar13 = this->rr + -1;
        if (-1 < pQVar5->torow) {
          iVar13 = pQVar5->torow;
        }
        if (iVar7 != iVar13) {
          iVar12 = *(int *)((long)sizes.super_QVLABase<QGridLayoutSizeTriple>.super_QVLABaseBase.ptr
                           + lVar14 * 8 + -4);
          iVar1 = *(int *)((long)sizes.super_QVLABase<QGridLayoutSizeTriple>.super_QVLABaseBase.ptr
                          + lVar14 * 8 + 4);
          iVar8 = QGridBox::vStretch(pQVar5);
          distributeMultiBox(chain,iVar7,iVar13,iVar12,iVar1,&this->rStretch,iVar8);
        }
        iVar7 = pQVar5->col;
        iVar13 = this->cc + -1;
        if (-1 < pQVar5->tocol) {
          iVar13 = pQVar5->tocol;
        }
        if (iVar7 != iVar13) {
          iVar12 = *(int *)((long)sizes.super_QVLABase<QGridLayoutSizeTriple>.super_QVLABaseBase.ptr
                           + lVar14 * 8 + -8);
          iVar1 = *(int *)((long)sizes.super_QVLABase<QGridLayoutSizeTriple>.super_QVLABaseBase.ptr
                          + lVar14 * 8);
          iVar8 = QGridBox::hStretch(pQVar5);
          distributeMultiBox(chain_00,iVar7,iVar13,iVar12,iVar1,&this->cStretch,iVar8);
        }
        lVar14 = lVar14 + 3;
      }
    }
    lVar14 = 0x14;
    for (lVar16 = 0; lVar16 < this->rr; lVar16 = lVar16 + 1) {
      pQVar6 = (this->rowData).d.ptr;
      bVar10 = true;
      if (*(char *)((long)&pQVar6->stretch + lVar14) == '\0') {
        bVar10 = 0 < *(int *)((long)pQVar6 + lVar14 + -0x14);
      }
      pQVar9 = QList<QLayoutStruct>::data(chain);
      *(bool *)((long)&pQVar9->stretch + lVar14) = bVar10;
      lVar14 = lVar14 + 0x20;
    }
    lVar14 = 0x14;
    for (lVar16 = 0; lVar16 < this->cc; lVar16 = lVar16 + 1) {
      pQVar6 = (this->colData).d.ptr;
      bVar10 = true;
      if (*(char *)((long)&pQVar6->stretch + lVar14) == '\0') {
        bVar10 = 0 < *(int *)((long)pQVar6 + lVar14 + -0x14);
      }
      pQVar9 = QList<QLayoutStruct>::data(chain_00);
      *(bool *)((long)&pQVar9->stretch + lVar14) = bVar10;
      lVar14 = lVar14 + 0x20;
    }
    QLayout::getContentsMargins
              (this_00,&this->leftMargin,&this->topMargin,&this->rightMargin,&this->bottomMargin);
    this->field_0x194 = this->field_0x194 & 0xfb;
    QVarLengthArray<QGridBox_*,_256LL>::~QVarLengthArray(&grid);
    QVarLengthArray<QGridLayoutSizeTriple,_256LL>::~QVarLengthArray(&sizes);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGridLayoutPrivate::setupLayoutData(int hSpacing, int vSpacing)
{
    Q_Q(QGridLayout);

#ifndef QT_LAYOUT_DISABLE_CACHING
    if (!needRecalc)
        return;
#endif
    has_hfw = false;
    int i;

    for (i = 0; i < rr; i++) {
        rowData[i].init(rStretch.at(i), rMinHeights.at(i));
        rowData[i].maximumSize = rStretch.at(i) ? QLAYOUTSIZE_MAX : rMinHeights.at(i);
    }
    for (i = 0; i < cc; i++) {
        colData[i].init(cStretch.at(i), cMinWidths.at(i));
        colData[i].maximumSize = cStretch.at(i) ? QLAYOUTSIZE_MAX : cMinWidths.at(i);
    }

    int n = things.size();
    QVarLengthArray<QGridLayoutSizeTriple> sizes(n);

    bool has_multi = false;

    /*
        Grid of items. We use it to determine which items are
        adjacent to which and compute the spacings correctly.
    */
    QVarLengthArray<QGridBox *> grid(rr * cc);
    memset(grid.data(), 0, rr * cc * sizeof(QGridBox *));

    /*
        Initialize 'sizes' and 'grid' data structures, and insert
        non-spanning items to our row and column data structures.
    */
    for (i = 0; i < n; ++i) {
        QGridBox * const box = things.at(i);
        sizes[i].minS = box->minimumSize();
        sizes[i].hint = box->sizeHint();
        sizes[i].maxS = box->maximumSize();

        if (box->hasHeightForWidth())
            has_hfw = true;

        if (box->row == box->toRow(rr)) {
            addData(box, sizes[i], true, false);
        } else {
            initEmptyMultiBox(rowData, box->row, box->toRow(rr));
            has_multi = true;
        }

        if (box->col == box->toCol(cc)) {
            addData(box, sizes[i], false, true);
        } else {
            initEmptyMultiBox(colData, box->col, box->toCol(cc));
            has_multi = true;
        }

        for (int r = box->row; r <= box->toRow(rr); ++r) {
            for (int c = box->col; c <= box->toCol(cc); ++c) {
                gridAt(grid.data(), r, c, cc) = box;
            }
        }
    }

    setupSpacings(colData, grid.data(), hSpacing, Qt::Horizontal);
    setupSpacings(rowData, grid.data(), vSpacing, Qt::Vertical);

    /*
        Insert multicell items to our row and column data structures.
        This must be done after the non-spanning items to obtain a
        better distribution in distributeMultiBox().
    */
    if (has_multi) {
        for (i = 0; i < n; ++i) {
            QGridBox * const box = things.at(i);

            if (box->row != box->toRow(rr))
                distributeMultiBox(rowData, box->row, box->toRow(rr), sizes[i].minS.height(),
                                   sizes[i].hint.height(), rStretch, box->vStretch());
            if (box->col != box->toCol(cc))
                distributeMultiBox(colData, box->col, box->toCol(cc), sizes[i].minS.width(),
                                   sizes[i].hint.width(), cStretch, box->hStretch());
        }
    }

    for (i = 0; i < rr; i++)
        rowData[i].expansive = rowData.at(i).expansive || rowData.at(i).stretch > 0;
    for (i = 0; i < cc; i++)
        colData[i].expansive = colData.at(i).expansive || colData.at(i).stretch > 0;

    q->getContentsMargins(&leftMargin, &topMargin, &rightMargin, &bottomMargin);

    needRecalc = false;
}